

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void increase_score(tgestate_t *state,uint8_t delta)

{
  char *pcVar1;
  char *tmp;
  char cVar2;
  char *pcVar3;
  
  pcVar1 = state->score_digits + 4;
  do {
    cVar2 = *pcVar1 + '\x01';
    *pcVar1 = cVar2;
    pcVar3 = pcVar1;
    while ('\t' < cVar2) {
      *pcVar3 = '\0';
      cVar2 = pcVar3[-1] + '\x01';
      pcVar3[-1] = cVar2;
      pcVar3 = pcVar3 + -1;
    }
    delta = delta + 0xff;
  } while (delta != '\0');
  plot_score(state);
  return;
}

Assistant:

void increase_score(tgestate_t *state, uint8_t delta)
{
  char *pdigit; /* was HL */

  assert(state != NULL);
  assert(delta > 0);

  /* Increment the score digit-wise until delta is zero. */

  assert(state->score_digits[0] <= 9);
  assert(state->score_digits[1] <= 9);
  assert(state->score_digits[2] <= 9);
  assert(state->score_digits[3] <= 9);
  assert(state->score_digits[4] <= 9);

  pdigit = &state->score_digits[4];
  do
  {
    char *tmp; /* was HL */

    tmp = pdigit;
    for (;;)
    {
      (*pdigit)++;
      if (*pdigit < 10)
        break;

      *pdigit-- = 0;
    }
    pdigit = tmp;
  }
  while (--delta);

  plot_score(state);
}